

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall spirv_cross::CFG::CFG(CFG *this,Compiler *compiler_,SPIRFunction *func_)

{
  SPIRFunction *func__local;
  Compiler *compiler__local;
  CFG *this_local;
  
  this->compiler = compiler_;
  this->func = func_;
  ::std::
  unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
  ::unordered_map(&this->preceding_edges);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
  ::unordered_map(&this->succeeding_edges);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->immediate_dominators);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::CFG::VisitOrder,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>_>
  ::unordered_map(&this->visit_order);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->post_order);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->empty_vector);
  this->visit_count = 0;
  build_post_order_visit_order(this);
  build_immediate_dominators(this);
  return;
}

Assistant:

CFG::CFG(Compiler &compiler_, const SPIRFunction &func_)
    : compiler(compiler_)
    , func(func_)
{
	build_post_order_visit_order();
	build_immediate_dominators();
}